

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

bool gl4cts::CopyImage::Utils::unpackAndComaprePixels
               (GLenum left_format,GLenum left_type,GLenum left_internal_format,GLubyte *left_pixel,
               GLenum right_format,GLenum right_type,GLenum right_internal_format,
               GLubyte *right_pixel)

{
  bool bVar1;
  GLdouble left_blue;
  GLdouble right_alpha;
  GLdouble right_blue;
  GLdouble left_alpha;
  GLdouble left_red;
  GLdouble right_green;
  GLdouble right_red;
  GLdouble left_green;
  
  unpackPixel(left_format,left_type,left_pixel,&left_red,&left_green,&left_blue,&left_alpha);
  unpackPixel(right_format,right_type,right_pixel,&right_red,&right_green,&right_blue,&right_alpha);
  roundComponent(left_internal_format,0x1903,&left_red);
  roundComponent(left_internal_format,0x1904,&left_green);
  roundComponent(left_internal_format,0x1905,&left_blue);
  roundComponent(right_internal_format,0x1903,&right_red);
  roundComponent(right_internal_format,0x1904,&right_green);
  roundComponent(right_internal_format,0x1905,&right_blue);
  bVar1 = comparePixels(left_internal_format,&left_red,&left_green,&left_blue,&left_alpha,
                        right_internal_format,&right_red,&right_green,&right_blue,&right_alpha);
  return bVar1;
}

Assistant:

bool Utils::unpackAndComaprePixels(GLenum left_format, GLenum left_type, GLenum left_internal_format,
								   const GLubyte* left_pixel, GLenum right_format, GLenum right_type,
								   GLenum right_internal_format, const GLubyte* right_pixel)
{
	GLdouble left_red;
	GLdouble left_green;
	GLdouble left_blue;
	GLdouble left_alpha;
	GLdouble right_red;
	GLdouble right_green;
	GLdouble right_blue;
	GLdouble right_alpha;

	unpackPixel(left_format, left_type, left_pixel, left_red, left_green, left_blue, left_alpha);

	unpackPixel(right_format, right_type, right_pixel, right_red, right_green, right_blue, right_alpha);

	roundComponent(left_internal_format, GL_RED, left_red);
	roundComponent(left_internal_format, GL_GREEN, left_green);
	roundComponent(left_internal_format, GL_BLUE, left_blue);

	roundComponent(right_internal_format, GL_RED, right_red);
	roundComponent(right_internal_format, GL_GREEN, right_green);
	roundComponent(right_internal_format, GL_BLUE, right_blue);

	return comparePixels(left_internal_format, left_red, left_green, left_blue, left_alpha, right_internal_format,
						 right_red, right_green, right_blue, right_alpha);
}